

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

void __thiscall ParserTest_UglyAbutments_Test::TestBody(ParserTest_UglyAbutments_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_658;
  AssertHelper local_638;
  Message local_630;
  allocator local_621;
  string local_620;
  bool local_5f9;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_5c8;
  Message local_5c0;
  allocator local_5b1;
  string local_5b0;
  bool local_589;
  undefined1 local_588 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_558;
  Message local_550;
  allocator local_541;
  string local_540;
  bool local_519;
  undefined1 local_518 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_4e8;
  Message local_4e0;
  allocator local_4d1;
  string local_4d0;
  bool local_4a9;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_478;
  Message local_470;
  allocator local_461;
  string local_460;
  bool local_439;
  undefined1 local_438 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_408;
  Message local_400;
  allocator local_3f1;
  string local_3f0;
  bool local_3c9;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_398;
  Message local_390;
  allocator local_381;
  string local_380;
  bool local_359;
  undefined1 local_358 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_328;
  Message local_320;
  allocator local_311;
  string local_310;
  bool local_2e9;
  undefined1 local_2e8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_2b8;
  Message local_2b0;
  allocator local_2a1;
  string local_2a0;
  bool local_279;
  undefined1 local_278 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_248;
  Message local_240;
  allocator local_231;
  string local_230;
  bool local_209;
  undefined1 local_208 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1d8;
  Message local_1d0;
  allocator local_1c1;
  string local_1c0;
  bool local_199;
  undefined1 local_198 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_168;
  Message local_160;
  allocator local_151;
  string local_150;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_f8;
  Message local_f0;
  allocator local_e1;
  string local_e0;
  bool local_b9;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_88;
  Message local_80 [3];
  allocator local_61;
  string local_60;
  bool local_39;
  undefined1 local_38 [8];
  AssertionResult gtest_ar_;
  P parser;
  ParserTest_UglyAbutments_Test *this_local;
  
  anon_unknown.dwarf_38f65::P::P((P *)&gtest_ar_.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"foo {p = 1x = 2}",&local_61);
  bVar1 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_60);
  local_39 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_38,&local_39,(type *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message(local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_38,
               (AssertionResult *)"parser.parse(\"foo {p = 1x = 2}\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x6f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"foo {p = 1x p2 = 2}",&local_e1);
  local_b9 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_e0);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_b8,&local_b9,(type *)0x0)
  ;
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_b8,
               (AssertionResult *)"parser.parse(\"foo {p = 1x p2 = 2}\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x70,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
    testing::internal::AssertHelper::~AssertHelper(&local_f8);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"foo {p = \'x\'x = 2}",&local_151);
  local_129 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_150);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_128,&local_129,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar1) {
    testing::Message::Message(&local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_128,
               (AssertionResult *)"parser.parse(\"foo {p = \'x\'x = 2}\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=(&local_168,&local_160);
    testing::internal::AssertHelper::~AssertHelper(&local_168);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"value=12asdf.foo {}",&local_1c1);
  bVar1 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_1c0);
  local_199 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_198,&local_199,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_198,
               (AssertionResult *)"parser.parse(\"value=12asdf.foo {}\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x72,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_1d8);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_230,"value=12asdf.foo nextsel {}",&local_231);
  local_209 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_230);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_208,&local_209,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_208,
               (AssertionResult *)"parser.parse(\"value=12asdf.foo nextsel {}\")","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x73,pcVar2);
    testing::internal::AssertHelper::operator=(&local_248,&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"foo {p = 1 x = 2}",&local_2a1);
  local_279 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_2a0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_278,&local_279,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_278,
               (AssertionResult *)"parser.parse(\"foo {p = 1 x = 2}\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x74,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_310,"foo{p=1;x=2}",&local_311);
  local_2e9 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_310);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2e8,&local_2e9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_310);
  std::allocator<char>::~allocator((allocator<char> *)&local_311);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e8);
  if (!bVar1) {
    testing::Message::Message(&local_320);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_2e8,
               (AssertionResult *)"parser.parse(\"foo{p=1;x=2}\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x75,pcVar2);
    testing::internal::AssertHelper::operator=(&local_328,&local_320);
    testing::internal::AssertHelper::~AssertHelper(&local_328);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_380,"foo{@overridep=1}",&local_381);
  bVar1 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_380);
  local_359 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_358,&local_359,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar1) {
    testing::Message::Message(&local_390);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_358,
               (AssertionResult *)"parser.parse(\"foo{@overridep=1}\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x76,pcVar2);
    testing::internal::AssertHelper::operator=(&local_398,&local_390);
    testing::internal::AssertHelper::~AssertHelper(&local_398);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3f0,"foo{@override /*hi*/ p=1}",&local_3f1);
  local_3c9 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_3f0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3c8,&local_3c9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__9.message_,(internal *)local_3c8,
               (AssertionResult *)"parser.parse(\"foo{@override /*hi*/ p=1}\")","false","true",in_R9
              );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x77,pcVar2);
    testing::internal::AssertHelper::operator=(&local_408,&local_400);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_460,"@import\'asdf\'",&local_461);
  local_439 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_460);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_438,&local_439,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
  if (!bVar1) {
    testing::Message::Message(&local_470);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_438,
               (AssertionResult *)"parser.parse(\"@import\'asdf\'\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_478,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x78,pcVar2);
    testing::internal::AssertHelper::operator=(&local_478,&local_470);
    testing::internal::AssertHelper::~AssertHelper(&local_478);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4d0,"@constrainasdf",&local_4d1);
  bVar1 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_4d0);
  local_4a9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4a8,&local_4a9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar1) {
    testing::Message::Message(&local_4e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_4a8,
               (AssertionResult *)"parser.parse(\"@constrainasdf\")","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x79,pcVar2);
    testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper(&local_4e8);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_4e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_540,"@import \'asdf\' \n ; \n @constrain asdf \n ; @import \'foo\'  ",
             &local_541);
  local_519 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_540);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_518,&local_519,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
  if (!bVar1) {
    testing::Message::Message(&local_550);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_518,
               (AssertionResult *)
               "parser.parse( \"@import \'asdf\' \\n ; \\n @constrain asdf \\n ; @import \'foo\'  \")"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_558,&local_550);
    testing::internal::AssertHelper::~AssertHelper(&local_558);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5b0,"@import /*hi*/ \'asdf\'",&local_5b1);
  local_589 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_5b0);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_588,&local_589,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_588);
  if (!bVar1) {
    testing::Message::Message(&local_5c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__13.message_,(internal *)local_588,
               (AssertionResult *)"parser.parse(\"@import /*hi*/ \'asdf\'\")","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_5c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x7c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_5c8,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper(&local_5c8);
    std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_588);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_620,"env.foo/* some comment */{ }",&local_621);
  local_5f9 = anon_unknown.dwarf_38f65::P::parse((P *)&gtest_ar_.message_,&local_620);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5f8,&local_5f9,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator((allocator<char> *)&local_621);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar1) {
    testing::Message::Message(&local_630);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_658,(internal *)local_5f8,
               (AssertionResult *)"parser.parse(\"env.foo/* some comment */{ }\")","false","true",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_638,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/parser/parser_test.cpp"
               ,0x7d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_638,&local_630);
    testing::internal::AssertHelper::~AssertHelper(&local_638);
    std::__cxx11::string::~string((string *)&local_658);
    testing::Message::~Message(&local_630);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  anon_unknown.dwarf_38f65::P::~P((P *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(ParserTest, UglyAbutments) {
  P parser;
  EXPECT_FALSE(parser.parse("foo {p = 1x = 2}"));
  EXPECT_TRUE(parser.parse("foo {p = 1x p2 = 2}"));
  EXPECT_TRUE(parser.parse("foo {p = 'x'x = 2}"));
  EXPECT_FALSE(parser.parse("value=12asdf.foo {}"));
  EXPECT_TRUE(parser.parse("value=12asdf.foo nextsel {}"));
  EXPECT_TRUE(parser.parse("foo {p = 1 x = 2}"));
  EXPECT_TRUE(parser.parse("foo{p=1;x=2}"));
  EXPECT_FALSE(parser.parse("foo{@overridep=1}"));
  EXPECT_TRUE(parser.parse("foo{@override /*hi*/ p=1}"));
  EXPECT_TRUE(parser.parse("@import'asdf'"));
  EXPECT_FALSE(parser.parse("@constrainasdf"));
  EXPECT_TRUE(parser.parse(
      "@import 'asdf' \n ; \n @constrain asdf \n ; @import 'foo'  "));
  EXPECT_TRUE(parser.parse("@import /*hi*/ 'asdf'"));
  EXPECT_TRUE(parser.parse("env.foo/* some comment */{ }"));
}